

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

char * __thiscall bloaty::Options::_InternalParse(Options *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  Arena *pAVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  bool bVar11;
  string *psVar12;
  byte *pbVar13;
  CustomDataSource *msg;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  char cVar17;
  uint32 uVar18;
  char *pcVar19;
  char cVar20;
  internal *piVar22;
  pair<const_char_*,_unsigned_int> pVar23;
  pair<const_char_*,_unsigned_long> pVar24;
  pair<const_char_*,_unsigned_long> pVar25;
  pair<const_char_*,_unsigned_long> pVar26;
  pair<const_char_*,_unsigned_long> pVar27;
  pair<const_char_*,_unsigned_long> pVar28;
  StringPiece str;
  StringPiece str_00;
  StringPiece str_01;
  StringPiece str_02;
  StringPiece str_03;
  StringPiece str_04;
  byte *local_88;
  uint local_7c;
  InternalMetadataWithArena *local_78;
  ArenaStringPtr *local_70;
  ArenaStringPtr *local_68;
  RepeatedPtrFieldBase *local_60;
  RepeatedPtrFieldBase *local_58;
  RepeatedPtrFieldBase *local_50;
  RepeatedPtrFieldBase *local_48;
  RepeatedPtrFieldBase *local_40;
  RepeatedPtrFieldBase *local_38;
  char *pcVar21;
  
  local_38 = &(this->source_map_).super_RepeatedPtrFieldBase;
  local_68 = &this->source_filter_;
  local_40 = &(this->debug_filename_).super_RepeatedPtrFieldBase;
  local_70 = &this->disassemble_function_;
  local_60 = &(this->custom_data_source_).super_RepeatedPtrFieldBase;
  local_78 = &this->_internal_metadata_;
  local_48 = &(this->data_source_).super_RepeatedPtrFieldBase;
  local_50 = &(this->base_filename_).super_RepeatedPtrFieldBase;
  local_58 = &(this->filename_).super_RepeatedPtrFieldBase;
  local_7c = 0;
  local_88 = (byte *)ptr;
  do {
    bVar11 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                       (&ctx->super_EpsCopyInputStream,(char **)&local_88,ctx->group_depth_);
    if (bVar11) goto LAB_0018dcc8;
    bVar1 = *local_88;
    pVar23.second._0_1_ = bVar1;
    pVar23.first = (char *)(local_88 + 1);
    pVar23._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_88[1];
      uVar18 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar23 = google::protobuf::internal::ReadTagFallback((char *)local_88,uVar18);
      }
      else {
        pVar23.second = uVar18;
        pVar23.first = (char *)(local_88 + 2);
        pVar23._12_4_ = 0;
      }
    }
    uVar10 = local_7c;
    local_88 = (byte *)pVar23.first;
    cVar20 = '\x04';
    if (local_88 != (byte *)0x0) {
      uVar18 = pVar23.second;
      uVar14 = (uint)(pVar23._8_8_ >> 3) & 0x1fffffff;
      uVar15 = uVar14 - 1;
      if (uVar15 < 0xf) {
        pcVar16 = (char *)((long)&switchD_0018d197::switchdataD_00343920 +
                          (long)(int)(&switchD_0018d197::switchdataD_00343920)[uVar15]);
        cVar17 = (char)pVar23.second;
        switch(uVar14) {
        case 1:
          if (cVar17 == '\n') {
            local_88 = local_88 + -1;
            do {
              local_88 = local_88 + 1;
              pRVar4 = (this->filename_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_0018d1d2:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (local_58,(this->filename_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0018d1e1:
                pRVar4 = (this->filename_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                pAVar5 = (this->filename_).super_RepeatedPtrFieldBase.arena_;
                if (pAVar5 == (Arena *)0x0) {
                  psVar12 = (string *)operator_new(0x20);
                }
                else {
                  if (pAVar5->hooks_cookie_ != (void *)0x0) {
                    google::protobuf::Arena::OnArenaAllocation
                              (pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                  }
                  psVar12 = (string *)
                            google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                      (&pAVar5->impl_,0x20,
                                       google::protobuf::internal::
                                       arena_destruct_object<std::__cxx11::string>);
                }
                (psVar12->_M_dataplus)._M_p = (pointer)&psVar12->field_2;
                psVar12->_M_string_length = 0;
                (psVar12->field_2)._M_local_buf[0] = '\0';
                pRVar4 = (this->filename_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->filename_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                (this->filename_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[(long)pcVar16] = psVar12;
              }
              else {
                iVar3 = (this->filename_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->filename_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0018d1d2;
                  goto LAB_0018d1e1;
                }
                (this->filename_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                psVar12 = (string *)pRVar4->elements[(long)pcVar16];
              }
              pbVar13 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                          (psVar12,(char *)local_88,ctx);
              piVar22 = (internal *)(psVar12->_M_dataplus)._M_p;
              pcVar21 = (char *)psVar12->_M_string_length;
              if ((long)pcVar21 < 0) {
                google::protobuf::StringPiece::LogFatalSizeTooBig
                          ((size_t)pcVar21,"size_t to int conversion");
              }
              str.length_ = (stringpiece_ssize_type)"bloaty.Options.filename";
              str.ptr_ = pcVar21;
              google::protobuf::internal::VerifyUTF8(piVar22,str,pcVar16);
              local_88 = pbVar13;
              if (pbVar13 == (byte *)0x0) goto LAB_0018dc8c;
            } while ((pbVar13 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar13 == 10));
LAB_0018dc19:
            cVar20 = '\x02';
            goto LAB_0018dc8c;
          }
          break;
        case 2:
          if (cVar17 == '\x12') {
            local_88 = local_88 + -1;
            do {
              local_88 = local_88 + 1;
              pRVar4 = (this->base_filename_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_0018d84d:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (local_50,(this->base_filename_).super_RepeatedPtrFieldBase.total_size_ +
                                    1);
LAB_0018d85c:
                pRVar4 = (this->base_filename_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                pAVar5 = (this->base_filename_).super_RepeatedPtrFieldBase.arena_;
                if (pAVar5 == (Arena *)0x0) {
                  psVar12 = (string *)operator_new(0x20);
                }
                else {
                  if (pAVar5->hooks_cookie_ != (void *)0x0) {
                    google::protobuf::Arena::OnArenaAllocation
                              (pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                  }
                  psVar12 = (string *)
                            google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                      (&pAVar5->impl_,0x20,
                                       google::protobuf::internal::
                                       arena_destruct_object<std::__cxx11::string>);
                }
                (psVar12->_M_dataplus)._M_p = (pointer)&psVar12->field_2;
                psVar12->_M_string_length = 0;
                (psVar12->field_2)._M_local_buf[0] = '\0';
                pRVar4 = (this->base_filename_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->base_filename_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                (this->base_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[(long)pcVar16] = psVar12;
              }
              else {
                iVar3 = (this->base_filename_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->base_filename_).super_RepeatedPtrFieldBase.total_size_)
                  goto LAB_0018d84d;
                  goto LAB_0018d85c;
                }
                (this->base_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                psVar12 = (string *)pRVar4->elements[(long)pcVar16];
              }
              pbVar13 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                          (psVar12,(char *)local_88,ctx);
              piVar22 = (internal *)(psVar12->_M_dataplus)._M_p;
              pcVar21 = (char *)psVar12->_M_string_length;
              if ((long)pcVar21 < 0) {
                google::protobuf::StringPiece::LogFatalSizeTooBig
                          ((size_t)pcVar21,"size_t to int conversion");
              }
              str_03.length_ = (stringpiece_ssize_type)"bloaty.Options.base_filename";
              str_03.ptr_ = pcVar21;
              google::protobuf::internal::VerifyUTF8(piVar22,str_03,pcVar16);
              local_88 = pbVar13;
              if (pbVar13 == (byte *)0x0) goto LAB_0018dc8c;
            } while ((pbVar13 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar13 == 0x12));
            goto LAB_0018dc19;
          }
          break;
        case 3:
          if (cVar17 == '\x1a') {
            local_88 = local_88 + -1;
            do {
              local_88 = local_88 + 1;
              pRVar4 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_0018d665:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (local_48,(this->data_source_).super_RepeatedPtrFieldBase.total_size_ + 1)
                ;
LAB_0018d674:
                pRVar4 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                pAVar5 = (this->data_source_).super_RepeatedPtrFieldBase.arena_;
                if (pAVar5 == (Arena *)0x0) {
                  psVar12 = (string *)operator_new(0x20);
                }
                else {
                  if (pAVar5->hooks_cookie_ != (void *)0x0) {
                    google::protobuf::Arena::OnArenaAllocation
                              (pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                  }
                  psVar12 = (string *)
                            google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                      (&pAVar5->impl_,0x20,
                                       google::protobuf::internal::
                                       arena_destruct_object<std::__cxx11::string>);
                }
                (psVar12->_M_dataplus)._M_p = (pointer)&psVar12->field_2;
                psVar12->_M_string_length = 0;
                (psVar12->field_2)._M_local_buf[0] = '\0';
                pRVar4 = (this->data_source_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[(long)pcVar16] = psVar12;
              }
              else {
                iVar3 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->data_source_).super_RepeatedPtrFieldBase.total_size_)
                  goto LAB_0018d665;
                  goto LAB_0018d674;
                }
                (this->data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                psVar12 = (string *)pRVar4->elements[(long)pcVar16];
              }
              pbVar13 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                          (psVar12,(char *)local_88,ctx);
              piVar22 = (internal *)(psVar12->_M_dataplus)._M_p;
              pcVar21 = (char *)psVar12->_M_string_length;
              if ((long)pcVar21 < 0) {
                google::protobuf::StringPiece::LogFatalSizeTooBig
                          ((size_t)pcVar21,"size_t to int conversion");
              }
              str_02.length_ = (stringpiece_ssize_type)"bloaty.Options.data_source";
              str_02.ptr_ = pcVar21;
              google::protobuf::internal::VerifyUTF8(piVar22,str_02,pcVar16);
              local_88 = pbVar13;
              if (pbVar13 == (byte *)0x0) goto LAB_0018dc8c;
            } while ((pbVar13 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar13 == 0x1a));
            goto LAB_0018dc19;
          }
          break;
        case 4:
          if (cVar17 == ' ') {
            bVar1 = *local_88;
            pVar25.second = (long)(char)bVar1;
            pVar25.first = (char *)local_88;
            pbVar13 = local_88 + 1;
            if ((long)(char)bVar1 < 0) {
              uVar18 = ((uint)*pbVar13 * 0x80 + (uint)bVar1) - 0x80;
              if ((char)*pbVar13 < '\0') {
                pVar25 = google::protobuf::internal::VarintParseSlow64((char *)local_88,uVar18);
              }
              else {
                pVar25.second._0_4_ = uVar18;
                pVar25.first = (char *)(local_88 + 2);
                pVar25.second._4_4_ = 0;
              }
              pbVar13 = (byte *)pVar25.first;
            }
            local_7c = uVar10 | 0x100;
            this->max_rows_per_level_ = pVar25.second;
            local_88 = pbVar13;
LAB_0018dc82:
            cVar20 = (local_88 == (byte *)0x0) * '\x02' + '\x02';
            goto LAB_0018dc8c;
          }
          break;
        case 5:
          if (cVar17 == '(') {
            bVar1 = *local_88;
            auVar8._8_8_ = (long)(char)bVar1;
            auVar8._0_8_ = local_88 + 1;
            auVar6 = auVar8._0_12_;
            if ((long)(char)bVar1 < 0) {
              bVar2 = local_88[1];
              uVar18 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
              if ((char)bVar2 < '\0') {
                pVar26 = google::protobuf::internal::VarintParseSlow64((char *)local_88,uVar18);
                auVar6 = pVar26._0_12_;
              }
              else {
                auVar6._8_4_ = uVar18;
                auVar6._0_8_ = local_88 + 2;
              }
            }
            local_88 = auVar6._0_8_;
            if (local_88 == (byte *)0x0) goto LAB_0018dc8c;
            if (auVar6._8_4_ < 3) {
              *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
              this->demangle_ = auVar6._8_4_;
            }
            else {
              _InternalParse();
            }
            goto LAB_0018dc19;
          }
          break;
        case 6:
          if (cVar17 == '0') {
            bVar1 = *local_88;
            auVar9._8_8_ = (long)(char)bVar1;
            auVar9._0_8_ = local_88 + 1;
            auVar7 = auVar9._0_12_;
            if ((long)(char)bVar1 < 0) {
              bVar2 = local_88[1];
              uVar18 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
              if ((char)bVar2 < '\0') {
                pVar26 = google::protobuf::internal::VarintParseSlow64((char *)local_88,uVar18);
                auVar7 = pVar26._0_12_;
              }
              else {
                auVar7._8_4_ = uVar18;
                auVar7._0_8_ = local_88 + 2;
              }
            }
            local_88 = auVar7._0_8_;
            if (local_88 == (byte *)0x0) goto LAB_0018dc8c;
            if (auVar7._8_4_ < 3) {
              *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
              this->sort_by_ = auVar7._8_4_;
            }
            else {
              _InternalParse();
            }
            goto LAB_0018dc19;
          }
          break;
        case 7:
          if (cVar17 == '8') {
            bVar1 = *local_88;
            pVar27.second = (long)(char)bVar1;
            pVar27.first = (char *)local_88;
            pbVar13 = local_88 + 1;
            if ((long)(char)bVar1 < 0) {
              uVar18 = ((uint)*pbVar13 * 0x80 + (uint)bVar1) - 0x80;
              if ((char)*pbVar13 < '\0') {
                pVar27 = google::protobuf::internal::VarintParseSlow64((char *)local_88,uVar18);
              }
              else {
                pVar27.second._0_4_ = uVar18;
                pVar27.first = (char *)(local_88 + 2);
                pVar27.second._4_4_ = 0;
              }
              pbVar13 = (byte *)pVar27.first;
            }
            local_7c = uVar10 | 0x10;
            this->verbose_level_ = (int32)pVar27.second;
            local_88 = pbVar13;
            goto LAB_0018dc82;
          }
          break;
        case 8:
          if (cVar17 == 'B') {
            local_88 = local_88 + -1;
            do {
              local_88 = local_88 + 1;
              pRVar4 = (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_0018d796:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (local_60,(this->custom_data_source_).super_RepeatedPtrFieldBase.
                                    total_size_ + 1);
LAB_0018d7a5:
                pRVar4 = (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                msg = google::protobuf::Arena::CreateMaybeMessage<bloaty::CustomDataSource>
                                ((this->custom_data_source_).super_RepeatedPtrFieldBase.arena_);
                pRVar4 = (this->custom_data_source_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
                (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[iVar3] = msg;
              }
              else {
                iVar3 = (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->custom_data_source_).super_RepeatedPtrFieldBase.total_size_)
                  goto LAB_0018d796;
                  goto LAB_0018d7a5;
                }
                (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                msg = (CustomDataSource *)pRVar4->elements[iVar3];
              }
              local_88 = (byte *)google::protobuf::internal::ParseContext::
                                 ParseMessage<bloaty::CustomDataSource>(ctx,msg,(char *)local_88);
              if (local_88 == (byte *)0x0) goto LAB_0018dc8c;
            } while ((local_88 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_88 == 0x42))
            ;
            goto LAB_0018dc19;
          }
          break;
        case 9:
          if (cVar17 == 'J') {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
            if ((this->disassemble_function_).ptr_ ==
                (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                        (local_70,(string *)
                                  &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
                        );
            }
            psVar12 = local_70->ptr_;
            pbVar13 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                        (psVar12,(char *)local_88,ctx);
            piVar22 = (internal *)(psVar12->_M_dataplus)._M_p;
            pcVar21 = (char *)psVar12->_M_string_length;
            if ((long)pcVar21 < 0) {
              google::protobuf::StringPiece::LogFatalSizeTooBig
                        ((size_t)pcVar21,"size_t to int conversion");
            }
            pcVar19 = "bloaty.Options.disassemble_function";
LAB_0018da51:
            str_04.length_ = (stringpiece_ssize_type)pcVar19;
            str_04.ptr_ = pcVar21;
            google::protobuf::internal::VerifyUTF8(piVar22,str_04,pcVar16);
            local_88 = pbVar13;
            goto LAB_0018dc82;
          }
          break;
        case 10:
          if (cVar17 == 'R') {
            local_88 = local_88 + -1;
            do {
              local_88 = local_88 + 1;
              pRVar4 = (this->debug_filename_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_0018d52c:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (local_40,(this->debug_filename_).super_RepeatedPtrFieldBase.total_size_ +
                                    1);
LAB_0018d53e:
                pRVar4 = (this->debug_filename_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                pAVar5 = (this->debug_filename_).super_RepeatedPtrFieldBase.arena_;
                if (pAVar5 == (Arena *)0x0) {
                  psVar12 = (string *)operator_new(0x20);
                }
                else {
                  if (pAVar5->hooks_cookie_ != (void *)0x0) {
                    google::protobuf::Arena::OnArenaAllocation
                              (pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                  }
                  psVar12 = (string *)
                            google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                      (&pAVar5->impl_,0x20,
                                       google::protobuf::internal::
                                       arena_destruct_object<std::__cxx11::string>);
                }
                (psVar12->_M_dataplus)._M_p = (pointer)&psVar12->field_2;
                psVar12->_M_string_length = 0;
                (psVar12->field_2)._M_local_buf[0] = '\0';
                pRVar4 = (this->debug_filename_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[(long)pcVar16] = psVar12;
              }
              else {
                iVar3 = (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->debug_filename_).super_RepeatedPtrFieldBase.total_size_)
                  goto LAB_0018d52c;
                  goto LAB_0018d53e;
                }
                (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                psVar12 = (string *)pRVar4->elements[(long)pcVar16];
              }
              pbVar13 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                          (psVar12,(char *)local_88,ctx);
              piVar22 = (internal *)(psVar12->_M_dataplus)._M_p;
              pcVar21 = (char *)psVar12->_M_string_length;
              if ((long)pcVar21 < 0) {
                google::protobuf::StringPiece::LogFatalSizeTooBig
                          ((size_t)pcVar21,"size_t to int conversion");
              }
              str_01.length_ = (stringpiece_ssize_type)"bloaty.Options.debug_filename";
              str_01.ptr_ = pcVar21;
              google::protobuf::internal::VerifyUTF8(piVar22,str_01,pcVar16);
              local_88 = pbVar13;
              if (pbVar13 == (byte *)0x0) goto LAB_0018dc8c;
            } while ((pbVar13 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar13 == 0x52));
            goto LAB_0018dc19;
          }
          break;
        case 0xb:
          if (cVar17 == 'X') {
            bVar1 = *local_88;
            pVar28.second = (long)(char)bVar1;
            pVar28.first = (char *)local_88;
            pbVar13 = local_88 + 1;
            if ((long)(char)bVar1 < 0) {
              uVar18 = ((uint)*pbVar13 * 0x80 + (uint)bVar1) - 0x80;
              if ((char)*pbVar13 < '\0') {
                pVar28 = google::protobuf::internal::VarintParseSlow64((char *)local_88,uVar18);
              }
              else {
                pVar28.second._0_4_ = uVar18;
                pVar28.first = (char *)(local_88 + 2);
                pVar28.second._4_4_ = 0;
              }
              pbVar13 = (byte *)pVar28.first;
            }
            local_7c = uVar10 | 0x40;
            this->debug_vmaddr_ = pVar28.second;
            local_88 = pbVar13;
            goto LAB_0018dc82;
          }
          break;
        case 0xc:
          if (cVar17 == '`') {
            bVar1 = *local_88;
            pVar24.second = (long)(char)bVar1;
            pVar24.first = (char *)local_88;
            pbVar13 = local_88 + 1;
            if ((long)(char)bVar1 < 0) {
              uVar18 = ((uint)*pbVar13 * 0x80 + (uint)bVar1) - 0x80;
              if ((char)*pbVar13 < '\0') {
                pVar24 = google::protobuf::internal::VarintParseSlow64((char *)local_88,uVar18);
              }
              else {
                pVar24.second._0_4_ = uVar18;
                pVar24.first = (char *)(local_88 + 2);
                pVar24.second._4_4_ = 0;
              }
              pbVar13 = (byte *)pVar24.first;
            }
            local_7c = uVar10 | 0x80;
            this->debug_fileoff_ = pVar24.second;
            local_88 = pbVar13;
            goto LAB_0018dc82;
          }
          break;
        case 0xd:
          if (cVar17 == 'j') {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            if ((this->source_filter_).ptr_ ==
                (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                        (local_68,(string *)
                                  &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
                        );
            }
            psVar12 = local_68->ptr_;
            pbVar13 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                        (psVar12,(char *)local_88,ctx);
            piVar22 = (internal *)(psVar12->_M_dataplus)._M_p;
            pcVar21 = (char *)psVar12->_M_string_length;
            if ((long)pcVar21 < 0) {
              google::protobuf::StringPiece::LogFatalSizeTooBig
                        ((size_t)pcVar21,"size_t to int conversion");
            }
            pcVar19 = "bloaty.Options.source_filter";
            goto LAB_0018da51;
          }
          break;
        case 0xe:
          if (cVar17 == 'p') {
            bVar1 = *local_88;
            pVar26.second = (long)(char)bVar1;
            pVar26.first = (char *)local_88;
            pbVar13 = local_88 + 1;
            if ((long)(char)bVar1 < 0) {
              uVar18 = ((uint)*pbVar13 * 0x80 + (uint)bVar1) - 0x80;
              if ((char)*pbVar13 < '\0') {
                pVar26 = google::protobuf::internal::VarintParseSlow64((char *)local_88,uVar18);
              }
              else {
                pVar26.second._0_4_ = uVar18;
                pVar26.first = (char *)(local_88 + 2);
                pVar26.second._4_4_ = 0;
              }
              pbVar13 = (byte *)pVar26.first;
            }
            local_7c = uVar10 | 0x20;
            this->dump_raw_map_ = pVar26.second != 0;
            local_88 = pbVar13;
            goto LAB_0018dc82;
          }
          break;
        case 0xf:
          if (cVar17 == 'z') {
            local_88 = local_88 + -1;
            do {
              local_88 = local_88 + 1;
              pRVar4 = (this->source_map_).super_RepeatedPtrFieldBase.rep_;
              if (pRVar4 == (Rep *)0x0) {
LAB_0018d30b:
                google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                          (local_38,(this->source_map_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0018d31d:
                pRVar4 = (this->source_map_).super_RepeatedPtrFieldBase.rep_;
                pRVar4->allocated_size = pRVar4->allocated_size + 1;
                pAVar5 = (this->source_map_).super_RepeatedPtrFieldBase.arena_;
                if (pAVar5 == (Arena *)0x0) {
                  psVar12 = (string *)operator_new(0x20);
                }
                else {
                  if (pAVar5->hooks_cookie_ != (void *)0x0) {
                    google::protobuf::Arena::OnArenaAllocation
                              (pAVar5,(type_info *)&std::__cxx11::string::typeinfo,0x20);
                  }
                  psVar12 = (string *)
                            google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
                                      (&pAVar5->impl_,0x20,
                                       google::protobuf::internal::
                                       arena_destruct_object<std::__cxx11::string>);
                }
                (psVar12->_M_dataplus)._M_p = (pointer)&psVar12->field_2;
                psVar12->_M_string_length = 0;
                (psVar12->field_2)._M_local_buf[0] = '\0';
                pRVar4 = (this->source_map_).super_RepeatedPtrFieldBase.rep_;
                iVar3 = (this->source_map_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                (this->source_map_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                pRVar4->elements[(long)pcVar16] = psVar12;
              }
              else {
                iVar3 = (this->source_map_).super_RepeatedPtrFieldBase.current_size_;
                pcVar16 = (char *)(long)iVar3;
                if (pRVar4->allocated_size <= iVar3) {
                  if (pRVar4->allocated_size ==
                      (this->source_map_).super_RepeatedPtrFieldBase.total_size_) goto LAB_0018d30b;
                  goto LAB_0018d31d;
                }
                (this->source_map_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
                psVar12 = (string *)pRVar4->elements[(long)pcVar16];
              }
              pbVar13 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                          (psVar12,(char *)local_88,ctx);
              piVar22 = (internal *)(psVar12->_M_dataplus)._M_p;
              pcVar21 = (char *)psVar12->_M_string_length;
              if ((long)pcVar21 < 0) {
                google::protobuf::StringPiece::LogFatalSizeTooBig
                          ((size_t)pcVar21,"size_t to int conversion");
              }
              str_00.length_ = (stringpiece_ssize_type)"bloaty.Options.source_map";
              str_00.ptr_ = pcVar21;
              google::protobuf::internal::VerifyUTF8(piVar22,str_00,pcVar16);
              local_88 = pbVar13;
              if (pbVar13 == (byte *)0x0) goto LAB_0018dc8c;
            } while ((pbVar13 < (ctx->super_EpsCopyInputStream).limit_end_) && (*pbVar13 == 0x7a));
            goto LAB_0018dc19;
          }
        }
      }
      if (uVar18 == 0 || (uVar18 & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar18 - 1;
        cVar20 = '\x13';
      }
      else {
        local_88 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (uVar18,local_78,(char *)local_88,ctx);
        cVar20 = (local_88 == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_0018dc8c:
  } while (cVar20 == '\x02');
  if (cVar20 == '\x04') {
    local_88 = (byte *)0x0;
  }
LAB_0018dcc8:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | local_7c;
  return (char *)local_88;
}

Assistant:

const char* Options::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated string filename = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_filename(), ptr, ctx, "bloaty.Options.filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string base_filename = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_base_filename(), ptr, ctx, "bloaty.Options.base_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string data_source = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_data_source(), ptr, ctx, "bloaty.Options.data_source");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // optional int64 max_rows_per_level = 4 [default = 20];
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 32)) {
          _Internal::set_has_max_rows_per_level(&has_bits);
          max_rows_per_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_Demangle_IsValid(val))) {
            _internal_set_demangle(static_cast<::bloaty::Options_Demangle>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(5, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(::bloaty::Options_SortBy_IsValid(val))) {
            _internal_set_sort_by(static_cast<::bloaty::Options_SortBy>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional int32 verbose_level = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          _Internal::set_has_verbose_level(&has_bits);
          verbose_level_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .bloaty.CustomDataSource custom_data_source = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_custom_data_source(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // optional string disassemble_function = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_disassemble_function(), ptr, ctx, "bloaty.Options.disassemble_function");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string debug_filename = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_debug_filename(), ptr, ctx, "bloaty.Options.debug_filename");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_vmaddr = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 88)) {
          _Internal::set_has_debug_vmaddr(&has_bits);
          debug_vmaddr_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional uint64 debug_fileoff = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 96)) {
          _Internal::set_has_debug_fileoff(&has_bits);
          debug_fileoff_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string source_filter = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 106)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_source_filter(), ptr, ctx, "bloaty.Options.source_filter");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool dump_raw_map = 14;
      case 14:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 112)) {
          _Internal::set_has_dump_raw_map(&has_bits);
          dump_raw_map_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated string source_map = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_source_map(), ptr, ctx, "bloaty.Options.source_map");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}